

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_sse4.c
# Opt level: O0

void highbd_vfilter8(int16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
                    int subpel_y_qn,int y_step_qn,InterpFilterParams *filter_params,
                    ConvolveParams *conv_params,int bd)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  byte bVar16;
  uint16_t uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint subpel;
  long lVar21;
  int16_t *piVar22;
  int16_t *src_00;
  undefined8 *puVar23;
  ulong *puVar24;
  int in_ECX;
  int iVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  long in_RDX;
  longlong extraout_RDX;
  int in_ESI;
  ulong uVar30;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int iVar31;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  int iVar34;
  int iVar35;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar36;
  undefined1 auVar37 [16];
  __m128i alVar38;
  __m128i coeff;
  __m128i coeff_00;
  __m128i coeff_01;
  uint in_stack_00000008;
  int in_stack_00000010;
  InterpFilterParams *in_stack_00000018;
  int *in_stack_00000020;
  int32_t tmp_1;
  int32_t tmp;
  CONV_BUF_TYPE res;
  int k;
  int32_t sum;
  int16_t *src_x;
  __m128i shifted_16;
  __m128i p_32;
  CONV_BUF_TYPE *dst_16_x;
  __m128i result;
  uint16_t *dst_x;
  __m128i shifted;
  __m128i conv;
  __m128i conv23;
  __m128i conv01;
  __m128i conv3;
  __m128i conv2;
  __m128i conv1;
  __m128i conv0;
  int16_t *src3;
  int16_t *src2;
  int16_t *src1;
  int16_t *src0;
  int x;
  __m128i coeff0716;
  int16_t *filter;
  int filter_idx;
  int16_t *src_y;
  int y;
  int y_qn;
  __m128i wt1;
  __m128i wt0;
  int w1;
  int w0;
  __m128i round_bits_const;
  __m128i round_bits_shift;
  int round_bits;
  __m128i res_add_const;
  __m128i round_shift_add;
  __m128i bits_const;
  __m128i bits_shift;
  int bits;
  __m128i clip_pixel_;
  int dst16_stride;
  CONV_BUF_TYPE *dst16;
  __m128i sub;
  int32_t sub32;
  __m128i round_shift;
  int ntaps;
  int offset_bits;
  int in_stack_fffffffffffff86c;
  int in_stack_fffffffffffff870;
  short local_77c;
  int local_768;
  int local_764;
  ulong local_758;
  undefined8 local_728;
  undefined8 uStack_720;
  int local_708;
  int iStack_704;
  int iStack_700;
  int iStack_6fc;
  int local_65c;
  int local_630;
  uint local_62c;
  byte local_5cc;
  byte local_57c;
  int local_368;
  int iStack_364;
  int iStack_360;
  int iStack_35c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  int local_348;
  int iStack_344;
  int iStack_340;
  int iStack_33c;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  short local_38;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  short local_18;
  short sStack_16;
  short sStack_14;
  short sStack_12;
  longlong lVar29;
  
  bVar5 = ((char)tmp - (char)in_stack_00000020[5]) + 0xe;
  uVar2 = in_stack_00000020[6];
  bVar16 = bVar5 - (char)in_stack_00000020[6];
  iVar18 = (1 << (bVar16 & 0x1f)) + (1 << (bVar16 - 1 & 0x1f));
  lVar4 = *(long *)(in_stack_00000020 + 2);
  iVar3 = in_stack_00000020[4];
  if (tmp == 10) {
    local_77c = 0x3ff;
  }
  else {
    local_77c = 0xff;
    if (tmp == 0xc) {
      local_77c = 0xfff;
    }
  }
  uVar19 = 0xe - (in_stack_00000020[5] + in_stack_00000020[6]);
  local_57c = (byte)uVar19;
  iVar25 = (1 << (local_57c & 0x1f)) >> 1;
  iVar26 = (1 << (*(byte *)(in_stack_00000020 + 6) & 0x1f)) >> 1;
  iVar28 = 1 << (bVar5 & 0x1f);
  uVar27 = 0xe - (in_stack_00000020[5] + in_stack_00000020[6]);
  local_5cc = (byte)uVar27;
  iVar20 = (1 << (local_5cc & 0x1f)) >> 1;
  iVar31 = in_stack_00000020[10];
  iVar34 = in_stack_00000020[0xb];
  auVar15._4_4_ = iVar31;
  auVar15._0_4_ = iVar31;
  auVar15._12_4_ = iVar31;
  auVar15._8_4_ = iVar31;
  auVar13._4_4_ = iVar34;
  auVar13._0_4_ = iVar34;
  auVar13._12_4_ = iVar34;
  auVar13._8_4_ = iVar34;
  local_62c = in_stack_00000008;
  for (local_630 = 0; local_630 < in_R9D; local_630 = local_630 + 1) {
    lVar21 = in_RDI + (long)((int)local_62c >> 10) * 2;
    subpel = (int)(local_62c & 0x3ff) >> 6;
    uVar30 = (ulong)subpel;
    piVar22 = av1_get_interp_filter_subpel_kernel(in_stack_00000018,subpel);
    lVar29 = extraout_RDX;
    for (local_65c = 0; local_65c <= in_R8D + -4; local_65c = local_65c + 4) {
      src_00 = (int16_t *)(lVar21 + (long)(local_65c * in_ESI) * 2);
      alVar38[1] = lVar29;
      alVar38[0] = uVar30;
      alVar38 = convolve_16_8(src_00,alVar38);
      coeff[1] = alVar38[1];
      coeff[0] = uVar30;
      alVar38 = convolve_16_8(src_00 + in_ESI,coeff);
      coeff_00[1] = alVar38[1];
      coeff_00[0] = uVar30;
      alVar38 = convolve_16_8(src_00 + (in_ESI << 1),coeff_00);
      coeff_01[1] = alVar38[1];
      coeff_01[0] = uVar30;
      alVar38 = convolve_16_8(src_00 + in_ESI * 3,coeff_01);
      lVar29 = alVar38[1];
      auVar7._8_8_ = extraout_XMM0_Qb;
      auVar7._0_8_ = extraout_XMM0_Qa;
      auVar32._8_8_ = extraout_XMM0_Qb_00;
      auVar32._0_8_ = extraout_XMM0_Qa_00;
      auVar32 = phaddd(auVar7,auVar32);
      auVar37._8_8_ = extraout_XMM0_Qb_01;
      auVar37._0_8_ = extraout_XMM0_Qa_01;
      auVar33._8_8_ = extraout_XMM0_Qb_02;
      auVar33._0_8_ = extraout_XMM0_Qa_02;
      auVar33 = phaddd(auVar37,auVar33);
      auVar33 = phaddd(auVar32,auVar33);
      local_308 = auVar33._0_4_;
      iStack_304 = auVar33._4_4_;
      iStack_300 = auVar33._8_4_;
      iStack_2fc = auVar33._12_4_;
      auVar33 = ZEXT416(uVar2);
      iVar31 = local_308 + iVar28 + iVar26 >> auVar33;
      iVar34 = iStack_304 + iVar28 + iVar26 >> auVar33;
      iVar35 = iStack_300 + iVar28 + iVar26 >> auVar33;
      iVar36 = iStack_2fc + iVar28 + iVar26 >> auVar33;
      puVar23 = (undefined8 *)(in_RDX + (long)(local_630 * in_ECX) * 2 + (long)local_65c * 2);
      if (in_stack_00000020[8] == 0) {
        auVar12._4_4_ = (iVar34 - iVar18) + iVar25;
        auVar12._0_4_ = (iVar31 - iVar18) + iVar25;
        auVar12._8_4_ = (iVar35 - iVar18) + iVar25;
        auVar12._12_4_ = (iVar36 - iVar18) + iVar25;
        auVar33 = psraw(auVar12,ZEXT416(uVar19));
        auVar33 = packusdw(auVar33,auVar33);
        local_38 = auVar33._0_2_;
        sStack_36 = auVar33._2_2_;
        sStack_34 = auVar33._4_2_;
        sStack_32 = auVar33._6_2_;
        local_728._0_4_ =
             CONCAT22((ushort)(local_77c < sStack_36) * local_77c |
                      (ushort)(local_77c >= sStack_36) * sStack_36,
                      (ushort)(local_77c < local_38) * local_77c |
                      (ushort)(local_77c >= local_38) * local_38);
        local_728._0_6_ =
             CONCAT24((ushort)(local_77c < sStack_34) * local_77c |
                      (ushort)(local_77c >= sStack_34) * sStack_34,(undefined4)local_728);
        local_728 = CONCAT26((ushort)(local_77c < sStack_32) * local_77c |
                             (ushort)(local_77c >= sStack_32) * sStack_32,(undefined6)local_728);
        *puVar23 = local_728;
      }
      else {
        puVar24 = (ulong *)(lVar4 + (long)(local_630 * iVar3) * 2 + (long)local_65c * 2);
        if (*in_stack_00000020 == 0) {
          auVar9._8_8_ = CONCAT44(iVar36,iVar35);
          auVar9._0_8_ = CONCAT44(iVar34,iVar31);
          auVar8._8_8_ = CONCAT44(iVar36,iVar35);
          auVar8._0_8_ = CONCAT44(iVar34,iVar31);
          auVar33 = packusdw(auVar9,auVar8);
          local_758 = auVar33._0_8_;
          *puVar24 = local_758;
        }
        else {
          uVar1 = *puVar24;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar1;
          auVar33 = pmovzxwd(auVar6,uVar1);
          if (in_stack_00000020[9] == 0) {
            local_368 = auVar33._0_4_;
            iStack_364 = auVar33._4_4_;
            iStack_360 = auVar33._8_4_;
            iStack_35c = auVar33._12_4_;
            auVar33 = ZEXT416(1);
            local_708 = local_368 + iVar31 >> auVar33;
            iStack_704 = iStack_364 + iVar34 >> auVar33;
            iStack_700 = iStack_360 + iVar35 >> auVar33;
            iStack_6fc = iStack_35c + iVar36 >> auVar33;
          }
          else {
            auVar37 = pmulld(auVar33,auVar15);
            auVar14._4_4_ = iVar34;
            auVar14._0_4_ = iVar31;
            auVar14._12_4_ = iVar36;
            auVar14._8_4_ = iVar35;
            auVar33 = pmulld(auVar14,auVar13);
            local_348 = auVar37._0_4_;
            iStack_344 = auVar37._4_4_;
            iStack_340 = auVar37._8_4_;
            iStack_33c = auVar37._12_4_;
            local_358 = auVar33._0_4_;
            iStack_354 = auVar33._4_4_;
            iStack_350 = auVar33._8_4_;
            iStack_34c = auVar33._12_4_;
            auVar33 = ZEXT416(4);
            local_708 = local_348 + local_358 >> auVar33;
            iStack_704 = iStack_344 + iStack_354 >> auVar33;
            iStack_700 = iStack_340 + iStack_350 >> auVar33;
            iStack_6fc = iStack_33c + iStack_34c >> auVar33;
          }
          auVar33 = ZEXT416(uVar27);
          local_728 = CONCAT44((iStack_704 - iVar18) + iVar20 >> auVar33,
                               (local_708 - iVar18) + iVar20 >> auVar33);
          uStack_720._0_4_ = (iStack_700 - iVar18) + iVar20 >> auVar33;
          uStack_720._4_4_ = (iStack_6fc - iVar18) + iVar20 >> auVar33;
          auVar11._8_8_ = uStack_720;
          auVar11._0_8_ = local_728;
          auVar10._8_8_ = uStack_720;
          auVar10._0_8_ = local_728;
          auVar33 = packusdw(auVar11,auVar10);
          local_18 = auVar33._0_2_;
          sStack_16 = auVar33._2_2_;
          sStack_14 = auVar33._4_2_;
          sStack_12 = auVar33._6_2_;
          local_728._0_4_ =
               CONCAT22((ushort)(local_77c < sStack_16) * local_77c |
                        (ushort)(local_77c >= sStack_16) * sStack_16,
                        (ushort)(local_77c < local_18) * local_77c |
                        (ushort)(local_77c >= local_18) * local_18);
          local_728._0_6_ =
               CONCAT24((ushort)(local_77c < sStack_14) * local_77c |
                        (ushort)(local_77c >= sStack_14) * sStack_14,(undefined4)local_728);
          local_728 = CONCAT26((ushort)(local_77c < sStack_12) * local_77c |
                               (ushort)(local_77c >= sStack_12) * sStack_12,(undefined6)local_728);
          *puVar23 = local_728;
        }
      }
    }
    for (; local_65c < in_R8D; local_65c = local_65c + 1) {
      local_764 = 1 << (bVar5 & 0x1f);
      for (local_768 = 0; local_768 < 8; local_768 = local_768 + 1) {
        local_764 = (int)piVar22[local_768] *
                    (int)*(short *)(lVar21 + (long)(local_65c * in_ESI) * 2 + (long)local_768 * 2) +
                    local_764;
      }
      if (in_stack_00000020[8] == 0) {
        uVar17 = clip_pixel_highbd(in_stack_fffffffffffff870,in_stack_fffffffffffff86c);
        *(uint16_t *)(in_RDX + (long)(local_630 * in_ECX + local_65c) * 2) = uVar17;
      }
      else if (*in_stack_00000020 == 0) {
        *(short *)(lVar4 + (long)(local_630 * iVar3 + local_65c) * 2) =
             (short)(local_764 + ((1 << ((byte)in_stack_00000020[6] & 0x1f)) >> 1) >>
                    ((byte)in_stack_00000020[6] & 0x1f));
      }
      else {
        uVar17 = clip_pixel_highbd(in_stack_fffffffffffff870,in_stack_fffffffffffff86c);
        *(uint16_t *)(in_RDX + (long)(local_630 * in_ECX + local_65c) * 2) = uVar17;
      }
    }
    local_62c = in_stack_00000010 + local_62c;
  }
  return;
}

Assistant:

static void highbd_vfilter8(const int16_t *src, int src_stride, uint16_t *dst,
                            int dst_stride, int w, int h, int subpel_y_qn,
                            int y_step_qn,
                            const InterpFilterParams *filter_params,
                            const ConvolveParams *conv_params, int bd) {
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int ntaps = 8;

  const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_1);

  const int32_t sub32 = ((1 << (offset_bits - conv_params->round_1)) +
                         (1 << (offset_bits - conv_params->round_1 - 1)));
  const __m128i sub = _mm_set1_epi32(sub32);

  CONV_BUF_TYPE *dst16 = conv_params->dst;
  const int dst16_stride = conv_params->dst_stride;
  const __m128i clip_pixel_ =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
  const __m128i bits_shift = _mm_cvtsi32_si128(bits);
  const __m128i bits_const = _mm_set1_epi32(((1 << bits) >> 1));
  const __m128i round_shift_add =
      _mm_set1_epi32(((1 << conv_params->round_1) >> 1));
  const __m128i res_add_const = _mm_set1_epi32(1 << offset_bits);
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  __m128i round_bits_shift = _mm_cvtsi32_si128(round_bits);
  __m128i round_bits_const = _mm_set1_epi32(((1 << round_bits) >> 1));

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);

  int y_qn = subpel_y_qn;
  for (int y = 0; y < h; ++y, y_qn += y_step_qn) {
    const int16_t *src_y = src + (y_qn >> SCALE_SUBPEL_BITS);
    const int filter_idx = (y_qn & SCALE_SUBPEL_MASK) >> SCALE_EXTRA_BITS;
    assert(filter_idx < SUBPEL_SHIFTS);
    const int16_t *filter =
        av1_get_interp_filter_subpel_kernel(filter_params, filter_idx);

    const __m128i coeff0716 = _mm_loadu_si128((__m128i *)filter);
    int x;
    for (x = 0; x <= w - 4; x += 4) {
      const int16_t *const src0 = src_y + x * src_stride;
      const int16_t *const src1 = src0 + 1 * src_stride;
      const int16_t *const src2 = src0 + 2 * src_stride;
      const int16_t *const src3 = src0 + 3 * src_stride;

      // Load the source data for the three rows, adding the three registers of
      // convolved products to one as we go (conv0..conv3) to avoid the
      // register pressure getting too high.
      const __m128i conv0 = convolve_16_8(src0, coeff0716);
      const __m128i conv1 = convolve_16_8(src1, coeff0716);
      const __m128i conv2 = convolve_16_8(src2, coeff0716);
      const __m128i conv3 = convolve_16_8(src3, coeff0716);

      // Now reduce horizontally to get one lane for each result
      const __m128i conv01 = _mm_hadd_epi32(conv0, conv1);
      const __m128i conv23 = _mm_hadd_epi32(conv2, conv3);
      __m128i conv = _mm_hadd_epi32(conv01, conv23);
      conv = _mm_add_epi32(conv, res_add_const);

      // Divide down by (1 << round_1), rounding to nearest and subtract sub32.
      __m128i shifted =
          _mm_sra_epi32(_mm_add_epi32(conv, round_shift_add), round_shift);

      uint16_t *dst_x = dst + y * dst_stride + x;

      __m128i result;
      if (conv_params->is_compound) {
        CONV_BUF_TYPE *dst_16_x = dst16 + y * dst16_stride + x;
        if (conv_params->do_average) {
          __m128i p_32 =
              _mm_cvtepu16_epi32(_mm_loadl_epi64((__m128i *)dst_16_x));

          if (conv_params->use_dist_wtd_comp_avg) {
            shifted = _mm_add_epi32(_mm_mullo_epi32(p_32, wt0),
                                    _mm_mullo_epi32(shifted, wt1));
            shifted = _mm_srai_epi32(shifted, DIST_PRECISION_BITS);
          } else {
            shifted = _mm_srai_epi32(_mm_add_epi32(p_32, shifted), 1);
          }
          result = _mm_sub_epi32(shifted, sub);
          result = _mm_sra_epi32(_mm_add_epi32(result, round_bits_const),
                                 round_bits_shift);

          result = _mm_packus_epi32(result, result);
          result = _mm_min_epi16(result, clip_pixel_);
          _mm_storel_epi64((__m128i *)dst_x, result);
        } else {
          __m128i shifted_16 = _mm_packus_epi32(shifted, shifted);
          _mm_storel_epi64((__m128i *)dst_16_x, shifted_16);
        }
      } else {
        result = _mm_sub_epi32(shifted, sub);
        result = _mm_sra_epi16(_mm_add_epi32(result, bits_const), bits_shift);
        result = _mm_packus_epi32(result, result);
        result = _mm_min_epi16(result, clip_pixel_);
        _mm_storel_epi64((__m128i *)dst_x, result);
      }
    }

    for (; x < w; ++x) {
      const int16_t *src_x = src_y + x * src_stride;
      int32_t sum = 1 << offset_bits;
      for (int k = 0; k < ntaps; ++k) sum += filter[k] * src_x[k];
      CONV_BUF_TYPE res = ROUND_POWER_OF_TWO(sum, conv_params->round_1);
      if (conv_params->is_compound) {
        if (conv_params->do_average) {
          int32_t tmp = dst16[y * dst16_stride + x];
          if (conv_params->use_dist_wtd_comp_avg) {
            tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
            tmp = tmp >> DIST_PRECISION_BITS;
          } else {
            tmp += res;
            tmp = tmp >> 1;
          }
          /* Subtract round offset and convolve round */
          tmp = tmp - ((1 << (offset_bits - conv_params->round_1)) +
                       (1 << (offset_bits - conv_params->round_1 - 1)));
          dst[y * dst_stride + x] =
              clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, bits), bd);
        } else {
          dst16[y * dst16_stride + x] = res;
        }
      } else {
        /* Subtract round offset and convolve round */
        int32_t tmp = res - ((1 << (offset_bits - conv_params->round_1)) +
                             (1 << (offset_bits - conv_params->round_1 - 1)));
        dst[y * dst_stride + x] =
            clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, bits), bd);
      }
    }
  }
}